

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

void __thiscall SslUdpSocketImpl::Close(SslUdpSocketImpl *this)

{
  mutex *pmVar1;
  atomic<unsigned_long> *paVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  SSL *pSVar6;
  wstring *pwVar7;
  wchar_t *pwVar8;
  __array temp;
  size_t len;
  unique_lock<std::mutex> lock;
  _Head_base<0UL,_unsigned_char_*,_false> local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_68;
  unique_lock<std::mutex> local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  this->m_bCloseReq = true;
  iVar4 = (*(this->super_UdpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[8])();
  if ((iVar4 == 0) &&
     (iVar4 = OpenSSLWrapper::SslConnection::SSLGetShutdown
                        ((this->m_pSslCon)._M_t.
                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                         .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl
                        ), iVar4 < 1)) {
    local_60._M_device = &this->m_mxEnDecode;
    local_60._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_60);
    local_60._M_owns = true;
    sVar5 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    if (sVar5 == 0) {
      bVar3 = false;
    }
    else {
      pmVar1 = &(this->super_UdpSocketImpl).m_mxOutDeque;
      local_68 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                  *)&(this->super_UdpSocketImpl).m_quOutData;
      local_70 = &this->m_strDestAddr;
      bVar3 = false;
      do {
        pSVar6 = OpenSSLWrapper::SslConnection::operator()
                           ((this->m_pSslCon)._M_t.
                            super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                            .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                            _M_head_impl);
        __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                  (&local_50,vswprintf,0x20,L"%lu",pSVar6);
        pwVar7 = (wstring *)
                 std::__cxx11::wstring::replace((ulong)&local_50,0,(wchar_t *)0x0,0x134580);
        std::__cxx11::wstring::wstring((wstring *)local_90,pwVar7);
        pwVar7 = (wstring *)std::__cxx11::wstring::append((wchar_t *)local_90);
        std::__cxx11::wstring::wstring((wstring *)local_b0,pwVar7);
        OutputDebugString((wchar_t *)local_b0[0]._M_head_impl);
        if ((long *)local_b0[0]._M_head_impl != local_a0) {
          operator_delete(local_b0[0]._M_head_impl,local_a0[0] * 4 + 4);
        }
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] * 4 + 4);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 4 + 4);
        }
        pwVar8 = (wchar_t *)operator_new__(sVar5);
        memset(pwVar8,0,sVar5);
        local_b0[0]._M_head_impl = (uchar *)pwVar8;
        local_90[0] = (long *)OpenSSLWrapper::SslConnection::SslGetOutData
                                        ((this->m_pSslCon)._M_t.
                                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                         .
                                         super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>
                                         ._M_head_impl,(uint8_t *)pwVar8,sVar5);
        if (local_90[0] != (long *)0x0) {
          iVar4 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
          if (iVar4 != 0) {
            std::__throw_system_error(iVar4);
          }
          LOCK();
          paVar2 = &(this->super_UdpSocketImpl).m_atOutBytes;
          (paVar2->super___atomic_base<unsigned_long>)._M_i =
               (paVar2->super___atomic_base<unsigned_long>)._M_i + (long)local_90[0];
          UNLOCK();
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string&>
                    (local_68,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                              local_b0,(unsigned_long *)local_90,local_70);
          pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
          bVar3 = true;
        }
        sVar5 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        if ((wchar_t *)local_b0[0]._M_head_impl != (wchar_t *)0x0) {
          operator_delete__(local_b0[0]._M_head_impl);
        }
      } while (sVar5 != 0);
    }
    OpenSSLWrapper::SslConnection::ShutDownConnection
              ((this->m_pSslCon)._M_t.
               super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ._M_t.
               super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,
               (int *)0x0);
    sVar5 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    if (sVar5 != 0) {
      pmVar1 = &(this->super_UdpSocketImpl).m_mxOutDeque;
      do {
        pwVar8 = (wchar_t *)operator_new__(sVar5);
        memset(pwVar8,0,sVar5);
        local_b0[0]._M_head_impl = (uchar *)pwVar8;
        local_90[0] = (long *)OpenSSLWrapper::SslConnection::SslGetOutData
                                        ((this->m_pSslCon)._M_t.
                                         super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                                         .
                                         super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>
                                         ._M_head_impl,(uint8_t *)pwVar8,sVar5);
        if (local_90[0] != (long *)0x0) {
          iVar4 = pthread_mutex_lock((pthread_mutex_t *)pmVar1);
          if (iVar4 != 0) {
            std::__throw_system_error(iVar4);
          }
          LOCK();
          paVar2 = &(this->super_UdpSocketImpl).m_atOutBytes;
          (paVar2->super___atomic_base<unsigned_long>)._M_i =
               (paVar2->super___atomic_base<unsigned_long>)._M_i + (long)local_90[0];
          UNLOCK();
          std::
          deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
          ::
          emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string&>
                    ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                      *)&(this->super_UdpSocketImpl).m_quOutData,
                     (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)local_b0,
                     (unsigned_long *)local_90,&this->m_strDestAddr);
          pthread_mutex_unlock((pthread_mutex_t *)pmVar1);
          bVar3 = true;
        }
        sVar5 = OpenSSLWrapper::SslConnection::SslGetOutDataSize
                          ((this->m_pSslCon)._M_t.
                           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>.
                           _M_head_impl);
        if ((wchar_t *)local_b0[0]._M_head_impl != (wchar_t *)0x0) {
          operator_delete__(local_b0[0]._M_head_impl);
        }
      } while (sVar5 != 0);
    }
    std::unique_lock<std::mutex>::unlock(&local_60);
    if (bVar3) {
      UdpSocketImpl::TriggerWriteThread(&this->super_UdpSocketImpl);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_60);
  }
  UdpSocketImpl::Close(&this->super_UdpSocketImpl);
  return;
}

Assistant:

void SslUdpSocketImpl::Close()
{
    //OutputDebugString(L"SslTcpSocketImpl::Close\r\n");
    m_bCloseReq = true;

    if (GetErrorNo() == 0)  // We get here not because of an error
    {
        if (m_pSslCon->SSLGetShutdown() < SSL_SENT_SHUTDOWN)
        {
            unique_lock<mutex> lock(m_mxEnDecode);
            bool bNewData = false;

            size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                OutputDebugString(wstring(L"SslGetOutDataSize unexpected full: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len, m_strDestAddr);
                    m_mxOutDeque.unlock();
                    bNewData = true;
                }
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }

            m_pSslCon->ShutDownConnection();
            // Get the out Que of the openssl bio, the buffer is already encrypted
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len, m_strDestAddr);
                    m_mxOutDeque.unlock();
                    bNewData = true;
                }
                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }

            lock.unlock();

            if (bNewData == true)
                TriggerWriteThread();
        }
    }

    UdpSocketImpl::Close();
}